

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  LogFunction *pLVar1;
  function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  func;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffa0;
  
  std::function<void(liblogger::LogType,std::__cxx11::string_const&)>::
  function<void(&)(liblogger::LogType,std::__cxx11::string_const&),void>
            (in_stack_ffffffffffffffa0,
             (_func_void_LogType_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  pLVar1 = (LogFunction *)operator_new(0x28);
  std::
  function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(in_stack_ffffffffffffffa0,
             (function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)CONCAT17(1,in_stack_ffffffffffffff98));
  liblogger::LogFunction::LogFunction(pLVar1,&stack0xffffffffffffffa0);
  liblogger::LogManager::Add((ILogger *)pLVar1);
  std::
  function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x1022e9);
  examples();
  liblogger::LogManager::RemoveAll();
  std::
  function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x102309);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	std::function<void(const LogType, const std::string &)> func = Function;
	LogManager::Add(new LogFunction(func));

	examples();

	LogManager::RemoveAll();
	return 0;
}